

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

int __thiscall Fl_Shared_Image::copy(Fl_Shared_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Shared_Image *this_00;
  size_t sVar2;
  char *pcVar3;
  Fl_Shared_Image *temp_shared;
  Fl_Image *temp_image;
  int H_local;
  int W_local;
  Fl_Shared_Image *this_local;
  
  if (this->image_ == (Fl_Image *)0x0) {
    temp_shared = (Fl_Shared_Image *)0x0;
  }
  else {
    iVar1 = (*this->image_->_vptr_Fl_Image[2])
                      (this->image_,(ulong)dst & 0xffffffff,(ulong)src & 0xffffffff);
    temp_shared = (Fl_Shared_Image *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = (Fl_Shared_Image *)operator_new(0x48);
  Fl_Shared_Image(this_00);
  sVar2 = strlen(this->name_);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  this_00->name_ = pcVar3;
  strcpy(this_00->name_,this->name_);
  this_00->refcount_ = 1;
  this_00->image_ = &temp_shared->super_Fl_Image;
  this_00->alloc_image_ = 1;
  update(this_00);
  return (int)this_00;
}

Assistant:

Fl_Image *
Fl_Shared_Image::copy(int W, int H) {
  Fl_Image		*temp_image;	// New image file
  Fl_Shared_Image	*temp_shared;	// New shared image

  // Make a copy of the image we're sharing...
  if (!image_) temp_image = 0;
  else temp_image = image_->copy(W, H);

  // Then make a new shared image...
  temp_shared = new Fl_Shared_Image();

  temp_shared->name_ = new char[strlen(name_) + 1];
  strcpy((char *)temp_shared->name_, name_);

  temp_shared->refcount_    = 1;
  temp_shared->image_       = temp_image;
  temp_shared->alloc_image_ = 1;

  temp_shared->update();

  return temp_shared;
}